

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::deleteFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint src;
  uint uVar1;
  int iVar2;
  string filename;
  
  requireDStackDepth(this,2,"DELETE-FILE");
  this_00 = &this->dStack;
  src = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&filename,src,(ulong)uVar1);
  iVar2 = remove(filename._M_dataplus._M_p);
  ForthStack<unsigned_int>::setTop(this_00,(uint)(iVar2 == 0) * 0x40 - 0x40);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void deleteFile() {
	REQUIRE_DSTACK_DEPTH(2, "DELETE-FILE");

	auto caddr = (dStack.getTop(1));
	auto length = SIZE_T(dStack.getTop()); pop();

	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	auto result = std::remove(filename.c_str());
	dStack.setTop(static_cast<Cell>(result?errorDeleteFile:0));
}